

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

void minihttp::URLEncode(string *s,string *enc)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  char local_3c;
  uint nib;
  uchar c;
  size_t i;
  ulong uStack_20;
  char buf [3];
  size_t len;
  string *enc_local;
  string *s_local;
  
  uStack_20 = std::__cxx11::string::length();
  i._5_1_ = 0x25;
  for (_nib = 0; _nib < uStack_20; _nib = _nib + 1) {
    pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)s);
    bVar1 = *pbVar3;
    iVar2 = isalnum((uint)bVar1);
    if ((((iVar2 == 0) && (bVar1 != 0x2d)) && (bVar1 != 0x5f)) &&
       ((bVar1 != 0x2e && (bVar1 != 0x2c)))) {
      if (bVar1 == 0x20) {
        std::__cxx11::string::operator+=((string *)enc,'+');
      }
      else {
        local_3c = (char)((int)(uint)bVar1 >> 4);
        if ((uint)((int)(uint)bVar1 >> 4) < 10) {
          local_3c = local_3c + '0';
        }
        else {
          local_3c = local_3c + 'W';
        }
        i._6_1_ = local_3c;
        bVar1 = bVar1 & 0xf;
        if (bVar1 < 10) {
          i._7_1_ = bVar1 + 0x30;
        }
        else {
          i._7_1_ = bVar1 + 0x57;
        }
        std::__cxx11::string::append((char *)enc,(long)&i + 5);
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)enc,bVar1);
    }
  }
  return;
}

Assistant:

void URLEncode(const std::string& s, std::string& enc)
{
    const size_t len = s.length();
    char buf[3];
    buf[0] = '%';
    for(size_t i = 0; i < len; i++)
    {
        const unsigned char c = s[i];
        // from  https://www.ietf.org/rfc/rfc1738.txt, page 3
        // with some changes for compatibility
        if(isalnum(c) || c == '-' || c == '_' || c == '.' || c == ',')
            enc += (char)c;
        else if(c == ' ')
            enc += '+';
        else
        {
            unsigned nib = (c >> 4) & 0xf;
            buf[1] = nib < 10 ? '0' + nib : 'a' + (nib-10);
            nib = c & 0xf;
            buf[2] = nib < 10 ? '0' + nib : 'a' + (nib-10);
            enc.append(&buf[0], 3);
        }
    }
}